

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deleteUnusedVariables.cpp
# Opt level: O3

void deleteUnusedVariables(Module *module,Program *program)

{
  Module *pMVar1;
  Function *pFVar2;
  Value *val;
  use_iterator_impl<const_llvm::Use> B;
  Func *this;
  Block *pBVar3;
  Expr *pEVar4;
  pointer ppEVar5;
  size_t sVar6;
  Function *f;
  BasicBlock *pBVar7;
  pointer ppEVar8;
  Function *block;
  BasicBlock *val_00;
  
  pMVar1 = *(Module **)(module + 0x20);
  do {
    if (pMVar1 == module + 0x18) {
      Program::addPass(program,DeleteUnusedVariables);
      return;
    }
    f = (Function *)(pMVar1 + -0x38);
    if (pMVar1 == (Module *)0x0) {
      f = (Function *)0x0;
    }
    this = Program::getFunction(program,f);
    for (pFVar2 = *(Function **)(f + 0x50); pFVar2 != f + 0x48; pFVar2 = *(Function **)(pFVar2 + 8))
    {
      block = pFVar2 + -0x18;
      if (pFVar2 == (Function *)0x0) {
        block = (Function *)0x0;
      }
      pBVar3 = Func::getBlock(this,(BasicBlock *)block);
      for (pBVar7 = *(BasicBlock **)((BasicBlock *)block + 0x30);
          pBVar7 != (BasicBlock *)block + 0x28; pBVar7 = *(BasicBlock **)(pBVar7 + 8)) {
        val_00 = pBVar7 + -0x18;
        if (pBVar7 == (BasicBlock *)0x0) {
          val_00 = (BasicBlock *)0x0;
        }
        if (((((Value *)val_00)[0x10] == (Value)0x3a) && (*(long *)((Value *)val_00 + 8) != 0)) &&
           (*(long *)(*(long *)((Value *)val_00 + 8) + 8) == 0)) {
          pEVar4 = Func::getExpr(this,(Value *)val_00);
          val = *(Value **)(*(long *)((Value *)val_00 + 8) + 0x18);
          if (((val != (Value *)0x0) && (val[0x10] == (Value)0x3c)) &&
             ((*(Value **)(val + -0x40) != (Value *)val_00 &&
              (*(Value **)(val + -0x20) == (Value *)val_00)))) {
            ppEVar8 = (pBVar3->expressions).super__Vector_base<Expr_*,_std::allocator<Expr_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            ppEVar5 = (pBVar3->expressions).super__Vector_base<Expr_*,_std::allocator<Expr_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            if (ppEVar8 != ppEVar5) {
              sVar6 = (long)ppEVar5 - (long)ppEVar8;
              do {
                sVar6 = sVar6 - 8;
                if (*ppEVar8 == pEVar4) {
                  if (ppEVar8 + 1 != ppEVar5) {
                    memmove(ppEVar8,ppEVar8 + 1,sVar6);
                    ppEVar5 = (pBVar3->expressions).
                              super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
                              super__Vector_impl_data._M_finish;
                  }
                  (pBVar3->expressions).super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
                  super__Vector_impl_data._M_finish = ppEVar5 + -1;
                  break;
                }
                ppEVar8 = ppEVar8 + 1;
              } while (ppEVar8 != ppEVar5);
            }
            pEVar4 = Func::getExpr(this,val);
            ppEVar8 = (pBVar3->expressions).super__Vector_base<Expr_*,_std::allocator<Expr_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            ppEVar5 = (pBVar3->expressions).super__Vector_base<Expr_*,_std::allocator<Expr_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            if (ppEVar8 != ppEVar5) {
              sVar6 = (long)ppEVar5 - (long)ppEVar8;
              do {
                sVar6 = sVar6 - 8;
                if (*ppEVar8 == pEVar4) {
                  if (ppEVar8 + 1 != ppEVar5) {
                    memmove(ppEVar8,ppEVar8 + 1,sVar6);
                    ppEVar5 = (pBVar3->expressions).
                              super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
                              super__Vector_impl_data._M_finish;
                  }
                  (pBVar3->expressions).super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
                  super__Vector_impl_data._M_finish = ppEVar5 + -1;
                  break;
                }
                ppEVar8 = ppEVar8 + 1;
              } while (ppEVar8 != ppEVar5);
            }
          }
        }
      }
    }
    pMVar1 = *(Module **)(pMVar1 + 8);
  } while( true );
}

Assistant:

void deleteUnusedVariables(const llvm::Module* module, Program& program) {
    assert(program.isPassCompleted(PassType::CreateExpressions));
    for (const llvm::Function& func : module->functions()) {
        auto* function = program.getFunction(&func);
        for (const auto& block : func) {
            auto* myBlock = function->getBlock(&block);

            for (const auto& ins : block) {
                if (ins.getOpcode() == llvm::Instruction::Alloca) {
                    if (ins.hasOneUse()) {
                        auto* alloca = function->getExpr(&ins);
                        auto* user = llvm::dyn_cast_or_null<llvm::StoreInst>(*ins.users().begin());
                        if (!user) {
                            continue;
                        }

                        // make sure the allocation is only used as a target of store
                        if (user->getValueOperand() != &ins && user->getPointerOperand() == &ins) {
                            deleteExprFromBlock(myBlock, alloca);
                            deleteExprFromBlock(myBlock, function->getExpr(user));
                        }
                    }
                }
            }
        }
    }

    program.addPass(PassType::DeleteUnusedVariables);
}